

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O3

ConstTestNodeIterator *
xe::ConstTestNodeIterator::begin(ConstTestNodeIterator *__return_storage_ptr__,TestNode *root)

{
  GroupState local_28;
  
  __return_storage_ptr__->m_root = root;
  (__return_storage_ptr__->m_iterStack).
  super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_iterStack).
  super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_iterStack).
  super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.group = (TestGroup *)0x0;
  local_28.childNdx = 0;
  std::
  vector<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
  ::_M_realloc_insert<xe::ConstTestNodeIterator::GroupState>
            (&__return_storage_ptr__->m_iterStack,(iterator)0x0,&local_28);
  return __return_storage_ptr__;
}

Assistant:

ConstTestNodeIterator ConstTestNodeIterator::begin (const TestNode* root)
{
	ConstTestNodeIterator iter(root);
	iter.m_iterStack.push_back(GroupState(DE_NULL));
	return iter;
}